

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.h
# Opt level: O0

void __thiscall
Catch::RunContext::handleNonExpr
          (RunContext *this,AssertionInfo *info,OfType resultType,AssertionReaction *reaction)

{
  OfType *this_00;
  char *pcVar1;
  size_type sVar2;
  char *pcVar3;
  size_t sVar4;
  size_type sVar5;
  bool bVar6;
  undefined1 local_120 [8];
  AssertionResult assertionResult;
  undefined1 local_80 [8];
  AssertionResultData data;
  AssertionReaction *reaction_local;
  OfType resultType_local;
  AssertionInfo *info_local;
  RunContext *this_local;
  
  (this->m_lastAssertionInfo).resultDisposition = info->resultDisposition;
  pcVar1 = (info->macroName).m_start;
  sVar2 = (info->macroName).m_size;
  pcVar3 = (info->lineInfo).file;
  sVar4 = (info->lineInfo).line;
  sVar5 = (info->capturedExpression).m_size;
  (this->m_lastAssertionInfo).capturedExpression.m_start = (info->capturedExpression).m_start;
  (this->m_lastAssertionInfo).capturedExpression.m_size = sVar5;
  (this->m_lastAssertionInfo).lineInfo.file = pcVar3;
  (this->m_lastAssertionInfo).lineInfo.line = sVar4;
  (this->m_lastAssertionInfo).macroName.m_start = pcVar1;
  (this->m_lastAssertionInfo).macroName.m_size = sVar2;
  this_00 = &assertionResult.m_resultData.resultType;
  data._80_8_ = reaction;
  LazyExpression::LazyExpression((LazyExpression *)this_00,false);
  AssertionResultData::AssertionResultData
            ((AssertionResultData *)local_80,resultType,(LazyExpression *)this_00);
  AssertionResult::AssertionResult
            ((AssertionResult *)local_120,info,(AssertionResultData *)local_80);
  assertionEnded(this,(AssertionResult *)local_120);
  bVar6 = AssertionResult::isOk((AssertionResult *)local_120);
  if (!bVar6) {
    populateReaction(this,(AssertionReaction *)data._80_8_);
  }
  AssertionResult::~AssertionResult((AssertionResult *)local_120);
  AssertionResultData::~AssertionResultData((AssertionResultData *)local_80);
  return;
}

Assistant:

void RunContext::handleNonExpr(
            AssertionInfo const &info,
            ResultWas::OfType resultType,
            AssertionReaction &reaction
    ) {
        m_lastAssertionInfo = info;

        AssertionResultData data( resultType, LazyExpression( false ) );
        AssertionResult assertionResult{ info, data };
        assertionEnded( assertionResult );

        if( !assertionResult.isOk() )
            populateReaction( reaction );
    }